

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O3

void beltWBLStepEBase(void *buf,size_t count,void *state)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  do {
    uVar2 = *buf;
    *(ulong *)((long)state + 0x20) = uVar2;
    uVar3 = *(ulong *)((long)buf + 8);
    *(ulong *)((long)state + 0x28) = uVar3;
    if (0x20 < count) {
      uVar4 = 0x20;
      do {
        uVar2 = uVar2 ^ *(ulong *)((long)buf + (uVar4 - 0x10));
        *(ulong *)((long)state + 0x20) = uVar2;
        uVar3 = uVar3 ^ *(ulong *)((long)buf + (uVar4 - 8));
        *(ulong *)((long)state + 0x28) = uVar3;
        uVar4 = uVar4 + 0x10;
      } while (uVar4 < count);
    }
    memMove(buf,(void *)((long)buf + 0x10),count - 0x10);
    *(undefined8 *)((long)buf + (count - 0x10)) = *(undefined8 *)((long)state + 0x20);
    *(undefined8 *)((long)buf + (count - 8)) = *(undefined8 *)((long)state + 0x28);
    beltBlockEncr((octet *)((long)state + 0x20),(u32 *)state);
    *(long *)((long)state + 0x40) = *(long *)((long)state + 0x40) + 1;
    memXor2((octet *)((long)state + 0x20),(void *)((long)state + 0x40),8);
    puVar1 = (ulong *)((long)buf + (count - 0x20));
    *puVar1 = *puVar1 ^ *(ulong *)((long)state + 0x20);
    puVar1 = (ulong *)((long)buf + (count - 0x18));
    *puVar1 = *puVar1 ^ *(ulong *)((long)state + 0x28);
  } while (*(ulong *)((long)state + 0x40) % (count + 0xf >> 3 & 0xfffffffffffffffe) != 0);
  return;
}

Assistant:

void beltWBLStepEBase(void* buf, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	word n = ((word)count + 15) / 16;
	ASSERT(count >= 32);
	ASSERT(memIsDisjoint2(buf, count, state, beltWBL_keep()));
	ASSERT(st->round % (2 * n) == 0);
	do
	{
		size_t i;
		// block <- r1 + ... + r_{n-1}
		beltBlockCopy(st->block, buf);
		for (i = 16; i + 16 < count; i += 16)
			beltBlockXor2(st->block, (octet*)buf + i);
		// r <- ShLo^128(r)
		memMove(buf, (octet*)buf + 16, count - 16);
		// r* <- block
		beltBlockCopy((octet*)buf + count - 16, st->block);
		// block <- beltBlockEncr(block) + <round>
		beltBlockEncr(st->block, st->key);
		st->round++;
#if (OCTET_ORDER == LITTLE_ENDIAN)
		memXor2(st->block, &st->round, O_PER_W);
#else // BIG_ENDIAN
		st->round = wordRev(st->round);
		memXor2(st->block, &st->round, O_PER_W);
		st->round = wordRev(st->round);
#endif // OCTET_ORDER
		// r*_до_сдвига <- r*_до_сдвига + block
		beltBlockXor2((octet*)buf + count - 32, st->block);
	}
	while (st->round % (2 * n));
}